

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O0

void deqp::gles3::Functional::DepthStencilCaseUtil::renderReference
               (vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
                *clears,PixelBufferAccess *dstColor,PixelBufferAccess *dstStencil,int stencilBits)

{
  int iVar1;
  size_type sVar2;
  PixelBufferAccess local_88;
  uint local_5c;
  int maskedVal;
  const_reference local_30;
  ClearCommand *clear;
  int ndx;
  int stencilBits_local;
  PixelBufferAccess *dstStencil_local;
  PixelBufferAccess *dstColor_local;
  vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
  *clears_local;
  
  clear._0_4_ = 0;
  clear._4_4_ = stencilBits;
  _ndx = dstStencil;
  dstStencil_local = dstColor;
  dstColor_local = (PixelBufferAccess *)clears;
  while( true ) {
    iVar1 = (int)clear;
    sVar2 = std::
            vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
            ::size((vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
                    *)dstColor_local);
    if ((int)sVar2 <= iVar1) break;
    local_30 = std::
               vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
               ::operator[]((vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
                             *)dstColor_local,(long)(int)clear);
    if ((local_30->buffers & 0x4000) != 0) {
      tcu::getSubregion((PixelBufferAccess *)&stack0xffffffffffffffa8,dstStencil_local,
                        (local_30->rect).left,(local_30->rect).bottom,(local_30->rect).width,
                        (local_30->rect).height);
      tcu::clear((PixelBufferAccess *)&stack0xffffffffffffffa8,&local_30->color);
    }
    if (((local_30->buffers & 0x400) != 0) && (0 < clear._4_4_)) {
      local_5c = local_30->stencil & (1 << ((byte)clear._4_4_ & 0x1f)) - 1U;
      tcu::getSubregion(&local_88,_ndx,(local_30->rect).left,(local_30->rect).bottom,
                        (local_30->rect).width,(local_30->rect).height);
      tcu::clearStencil(&local_88,local_5c);
    }
    clear._0_4_ = (int)clear + 1;
  }
  return;
}

Assistant:

void renderReference (const vector<ClearCommand>& clears, const tcu::PixelBufferAccess& dstColor, const tcu::PixelBufferAccess& dstStencil, int stencilBits)
{
	for (int ndx = 0; ndx < (int)clears.size(); ndx++)
	{
		const ClearCommand& clear = clears[ndx];

		if (clear.buffers & GL_COLOR_BUFFER_BIT)
			tcu::clear(tcu::getSubregion(dstColor, clear.rect.left, clear.rect.bottom, clear.rect.width, clear.rect.height), clear.color);

		if (clear.buffers & GL_STENCIL_BUFFER_BIT && stencilBits > 0)
		{
			int maskedVal = clear.stencil & ((1<<stencilBits)-1);
			tcu::clearStencil(tcu::getSubregion(dstStencil, clear.rect.left, clear.rect.bottom, clear.rect.width, clear.rect.height), maskedVal);
		}

		DE_ASSERT(clear.buffers == (clear.buffers & (GL_COLOR_BUFFER_BIT|GL_STENCIL_BUFFER_BIT))); // \note Don't use clear for depths.
	}
}